

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.h
# Opt level: O1

void __thiscall
GlobOpt::
TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::CopyPropReplaceOpnd(IR::Instr*,IR::Opnd*,StackSym*,IR::IndirOpnd*)::__0>
          (GlobOpt *this,Instr *trackByteCodeUseOnInstr,anon_class_24_3_cd72d7c2 fn)

{
  Type pJVar1;
  Instr *instr;
  BasicBlock *block;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed;
  Value *src1Val;
  PropertySym *local_50;
  PropertySym *tempPropertySymUse;
  PropertySym *local_40;
  BVSparse<Memory::JitArenaAllocator> *local_38;
  
  tempPropertySymUse = (PropertySym *)this->byteCodeUses;
  local_40 = this->propertySymUse;
  local_50 = (PropertySym *)0x0;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  instrByteCodeStackSymUsed =
       (BVSparse<Memory::JitArenaAllocator> *)
       new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3f1274);
  pJVar1 = this->tempAlloc;
  instrByteCodeStackSymUsed->head = (Type_conflict)0x0;
  instrByteCodeStackSymUsed->lastFoundIndex = (Type_conflict)0x0;
  instrByteCodeStackSymUsed->alloc = pJVar1;
  instrByteCodeStackSymUsed->lastUsedNodePrevNextField = (Type)instrByteCodeStackSymUsed;
  local_38 = this->byteCodeUsesBeforeOpt;
  this->byteCodeUsesBeforeOpt = instrByteCodeStackSymUsed;
  this->propertySymUse = (PropertySym *)0x0;
  TrackByteCodeSymUsed(trackByteCodeUseOnInstr,instrByteCodeStackSymUsed,&local_50);
  instr = *fn.checkObjTypeInstr;
  block = (fn.this)->currentBlock;
  src1Val = GlobOptBlockData::FindValue(&block->globOptData,&(*fn.copySym)->super_Sym);
  TryHoistInvariant(fn.this,instr,block,(Value *)0x0,src1Val,(Value *)0x0,true,false,false,
                    BailOutInvalid);
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)tempPropertySymUse;
  this->propertySymUse = local_40;
  this->byteCodeUsesBeforeOpt = local_38;
  return;
}

Assistant:

void TrackByteCodeUsesForInstrAddedInOptInstr(IR::Instr * trackByteCodeUseOnInstr, Fn fn)
    {
        BVSparse<JitArenaAllocator> *currentBytecodeUses = this->byteCodeUses;
        PropertySym * currentPropertySymUse = this->propertySymUse;
        PropertySym * tempPropertySymUse = NULL;
        this->byteCodeUses = NULL;
        BVSparse<JitArenaAllocator> *tempByteCodeUse = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
#if DBG
        BVSparse<JitArenaAllocator> *currentBytecodeUsesBeforeOpt = this->byteCodeUsesBeforeOpt;
        this->byteCodeUsesBeforeOpt = tempByteCodeUse;
#endif
        this->propertySymUse = NULL;
        GlobOpt::TrackByteCodeSymUsed(trackByteCodeUseOnInstr, tempByteCodeUse, &tempPropertySymUse);

        fn();

        this->byteCodeUses = currentBytecodeUses;
        this->propertySymUse = currentPropertySymUse;
#if DBG
        this->byteCodeUsesBeforeOpt = currentBytecodeUsesBeforeOpt;
#endif
    }